

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O2

int testNNValidatorBadOutput2(void)

{
  bool bVar1;
  ResultReason RVar2;
  ModelDescription *pMVar3;
  FeatureDescription *pFVar4;
  FeatureType *this;
  ArrayFeatureType *this_00;
  NeuralNetwork *pNVar5;
  NeuralNetworkLayer *this_01;
  InnerProductLayerParams *pIVar6;
  ostream *poVar7;
  int iVar8;
  char *pcVar9;
  Result res;
  Model m1;
  
  CoreML::Specification::Model::Model(&m1);
  pMVar3 = CoreML::Specification::Model::mutable_description(&m1);
  pFVar4 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar3->input_);
  CoreML::Specification::FeatureDescription::set_name(pFVar4,"input");
  this = CoreML::Specification::FeatureDescription::mutable_type(pFVar4);
  this_00 = CoreML::Specification::FeatureType::mutable_multiarraytype(this);
  CoreML::Specification::ArrayFeatureType::add_shape(this_00,1);
  pMVar3 = CoreML::Specification::Model::mutable_description(&m1);
  pFVar4 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar3->output_);
  CoreML::Specification::FeatureDescription::set_name(pFVar4,"output");
  pNVar5 = CoreML::Specification::Model::mutable_neuralnetwork(&m1);
  this_01 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                      (&pNVar5->layers_);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_01,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_01,"output");
  pIVar6 = CoreML::Specification::NeuralNetworkLayer::mutable_innerproduct(this_01);
  pIVar6->hasbias_ = false;
  CoreML::validate<(MLModelType)500>(&res,&m1);
  bVar1 = CoreML::Result::good(&res);
  if (bVar1) {
    poVar7 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar7 = std::operator<<(poVar7,":");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xa0);
    poVar7 = std::operator<<(poVar7,": error: ");
    pcVar9 = "!(((res)).good())";
  }
  else {
    RVar2 = CoreML::Result::reason(&res);
    iVar8 = 0;
    if (RVar2 == MODEL_OUTPUT_TYPE_INVALID) goto LAB_00147cd6;
    poVar7 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar7 = std::operator<<(poVar7,":");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xa0);
    poVar7 = std::operator<<(poVar7,": error: ");
    pcVar9 = "((ResultReason::MODEL_OUTPUT_TYPE_INVALID)) == ((res).reason())";
  }
  poVar7 = std::operator<<(poVar7,pcVar9);
  poVar7 = std::operator<<(poVar7," was false, expected true.");
  std::endl<char,std::char_traits<char>>(poVar7);
  iVar8 = 1;
LAB_00147cd6:
  std::__cxx11::string::~string((string *)&res.m_message);
  CoreML::Specification::Model::~Model(&m1);
  return iVar8;
}

Assistant:

int testNNValidatorBadOutput2() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);

    auto *out = m1.mutable_description()->add_output();
    out->set_name("output");

    auto *nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *innerProductLayer = nn->add_layers();
    innerProductLayer->add_input("input");
    innerProductLayer->add_output("output");
    Specification::InnerProductLayerParams *innerProductParams = innerProductLayer->mutable_innerproduct();

    innerProductParams->set_hasbias(false);

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD_WITH_REASON(res, ResultReason::MODEL_OUTPUT_TYPE_INVALID);

    return 0;
}